

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O3

QGraphicsItem * __thiscall
QGraphicsScene::itemAt(QGraphicsScene *this,QPointF *position,QTransform *deviceTransform)

{
  int *piVar1;
  QGraphicsItem *pQVar2;
  long in_FS_OFFSET;
  undefined4 local_28;
  undefined4 uStack_24;
  undefined4 uStack_20;
  undefined4 uStack_1c;
  undefined1 *local_18;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_28 = 0xaaaaaaaa;
  uStack_24 = 0xaaaaaaaa;
  uStack_20 = 0xaaaaaaaa;
  uStack_1c = 0xaaaaaaaa;
  (**(code **)(**(long **)(*(long *)(this + 8) + 0x88) + 0x68))
            (&local_28,*(long **)(*(long *)(this + 8) + 0x88),position,1,1,deviceTransform);
  if (local_18 == (undefined1 *)0x0) {
    pQVar2 = (QGraphicsItem *)0x0;
  }
  else {
    pQVar2 = *(QGraphicsItem **)CONCAT44(uStack_1c,uStack_20);
  }
  piVar1 = (int *)CONCAT44(uStack_24,local_28);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      QArrayData::deallocate((QArrayData *)CONCAT44(uStack_24,local_28),8,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return pQVar2;
  }
  __stack_chk_fail();
}

Assistant:

QGraphicsItem *QGraphicsScene::itemAt(const QPointF &position, const QTransform &deviceTransform) const
{
    const QList<QGraphicsItem *> itemsAtPoint = items(position, Qt::IntersectsItemShape,
                                                      Qt::DescendingOrder, deviceTransform);
    return itemsAtPoint.isEmpty() ? nullptr : itemsAtPoint.first();
}